

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.hpp
# Opt level: O1

void __thiscall
OpenMD::SelectionEvaluator::unrecognizedIdentifier(SelectionEvaluator *this,string *identifier)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  std::operator+(&local_28,"unrecognized identifier:",identifier);
  snprintf(painCave.errMsg,2000,"SelectionEvaluator Error: %s\n",local_28._M_dataplus._M_p);
  painCave.isFatal = 1;
  painCave.severity = 1;
  simError();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void unrecognizedIdentifier(const std::string& identifier) {
      evalError("unrecognized identifier:" + identifier);
    }